

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O3

Boxed_Value __thiscall chaiscript::ChaiScript_Basic::use(ChaiScript_Basic *this,string *t_filename)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  undefined8 this_00;
  Data *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  const_iterator cVar3;
  file_not_found_error *this_02;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  Boxed_Value BVar5;
  unique_lock<chaiscript::detail::threading::shared_mutex> l2;
  unique_lock<chaiscript::detail::threading::recursive_mutex> l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> appendedpath;
  unique_lock<std::shared_mutex> local_c8;
  unique_lock<std::recursive_mutex> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _func_int **local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_50 = t_filename[8].field_2._M_allocated_capacity;
  local_58 = *(undefined8 *)((long)&t_filename[8].field_2 + 8);
  if (local_50 != local_58) {
    local_38 = &t_filename->_M_string_length;
    local_40 = &t_filename[3]._M_string_length;
    local_48 = &t_filename[3].field_2;
    local_68 = t_filename + 2;
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   in_RDX);
    local_b8._M_owns = false;
    local_b8._M_device = (mutex_type *)(t_filename + 2);
    std::unique_lock<std::recursive_mutex>::lock(&local_b8);
    this_00 = local_40;
    local_b8._M_owns = true;
    local_c8._M_device = (mutex_type *)local_38;
    local_c8._M_owns = false;
    std::unique_lock<std::shared_mutex>::lock(&local_c8);
    local_c8._M_owns = true;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    this_01->_M_use_count = 1;
    this_01->_M_weak_count = 1;
    this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_003c3b08;
    this_01[1]._vptr__Sp_counted_base = (_func_int **)&Type_Info::Unknown_Type::typeinfo;
    *(pointer_____offset_0x10___ **)&this_01[1]._M_use_count = &Type_Info::Unknown_Type::typeinfo;
    *(undefined4 *)&this_01[2]._vptr__Sp_counted_base = 0x20;
    *(undefined8 *)((long)&this_01[2]._vptr__Sp_counted_base + 4) = 0;
    *(undefined8 *)&this_01[2]._M_weak_count = 0;
    *(undefined8 *)((long)&this_01[3]._vptr__Sp_counted_base + 4) = 0;
    *(undefined8 *)&this_01[3]._M_weak_count = 0;
    *(undefined8 *)((long)&this_01[4]._vptr__Sp_counted_base + 2) = 0;
    (this->m_mutex)._M_impl._M_rwlock.__align = (long)this_01;
    this->_vptr_ChaiScript_Basic = (_func_int **)(this_01 + 1);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00,&local_a8);
    if (cVar3._M_node == (_Base_ptr)local_48) {
      std::unique_lock<std::shared_mutex>::unlock(&local_c8);
      local_78 = 0;
      uStack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      eval_file((ChaiScript_Basic *)&stack0xffffffffffffff78,t_filename,
                (Exception_Handler *)&local_a8);
      uVar2 = uStack_80;
      pp_Var1 = local_88;
      local_88 = (_func_int **)0x0;
      uStack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this->_vptr_ChaiScript_Basic = pp_Var1;
      (this->m_mutex)._M_impl._M_rwlock.__align = uVar2;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_80 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_80);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_70 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_70);
      }
      std::unique_lock<std::shared_mutex>::lock(&local_c8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,&local_a8);
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_c8);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
    _Var4._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      _Var4._M_pi = extraout_RDX_00;
    }
    BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar5.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_02 = (file_not_found_error *)__cxa_allocate_exception(0x30);
  exception::file_not_found_error::file_not_found_error(this_02,in_RDX);
  __cxa_throw(this_02,&exception::file_not_found_error::typeinfo,
              exception::file_not_found_error::~file_not_found_error);
}

Assistant:

Boxed_Value use(const std::string &t_filename) {
      for (const auto &path : m_use_paths) {
        const auto appendedpath = path + t_filename;
        try {
          chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);
          chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l2(m_mutex);

          Boxed_Value retval;

          if (m_used_files.count(appendedpath) == 0) {
            l2.unlock();
            retval = eval_file(appendedpath);
            l2.lock();
            m_used_files.insert(appendedpath);
          }

          return retval; // return, we loaded it, or it was already loaded
        } catch (const exception::file_not_found_error &e) {
          if (e.filename != appendedpath) {
            // a nested file include failed
            throw;
          }
          // failed to load, try the next path
        }
      }

      // failed to load by any name
      throw exception::file_not_found_error(t_filename);
    }